

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemSubroutine.h
# Opt level: O2

void __thiscall slang::ast::SystemSubroutine::~SystemSubroutine(SystemSubroutine *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~SystemSubroutine() = default;